

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O2

void __thiscall FGameConfigFile::DoModSetup(FGameConfigFile *this,char *gamename)

{
  char *buffer;
  bool bVar1;
  
  buffer = this->section;
  mysnprintf(buffer,0x40,"%s.Player.Mod",gamename);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,buffer,false);
  if (bVar1) {
    ReadCVars(this,0x6002);
  }
  mysnprintf(buffer,0x40,"%s.LocalServerInfo.Mod",gamename);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,buffer,false);
  if (bVar1) {
    ReadCVars(this,0x6004);
  }
  this->bModSetup = true;
  return;
}

Assistant:

void FGameConfigFile::DoModSetup(const char *gamename)
{
	mysnprintf(section, countof(section), "%s.Player.Mod", gamename);
	if (SetSection(section))
	{
		ReadCVars(CVAR_MOD|CVAR_USERINFO|CVAR_IGNORE);
	}
	mysnprintf(section, countof(section), "%s.LocalServerInfo.Mod", gamename);
	if (SetSection (section))
	{
		ReadCVars (CVAR_MOD|CVAR_SERVERINFO|CVAR_IGNORE);
	}
	// Signal that these sections should be rewritten when saving the config.
	bModSetup = true;
}